

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateMetadataFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int iVar1;
  undefined4 extraout_var;
  bool in_CL;
  FileDescriptor *file_00;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string fullname;
  string filename;
  Printer printer;
  ZeroCopyOutputStream *output;
  
  file_00 = (FileDescriptor *)(CONCAT71(in_register_00000031,is_descriptor) & 0xffffffff);
  GeneratedMetadataFileName_abi_cxx11_(&filename,(php *)file,file_00,in_CL);
  iVar1 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1);
  io::Printer::Printer(&printer,output,'^');
  GenerateHead(file,&printer);
  FilenameToClassname(&fullname,&filename);
  iVar1 = std::__cxx11::string::find_last_of((char *)&fullname,0x38d6ed);
  if (iVar1 == -1) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"class ^name^\n{\n",(char (*) [5])0x38d8c6,&fullname);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_120,(ulong)&fullname);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"namespace ^name^;\n\n",(char (*) [5])0x38d8c6,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::substr((ulong)&local_120,(ulong)&fullname);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"class ^name^\n{\n",(char (*) [5])0x38d8c6,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  Indent(&printer);
  GenerateAddFileToPool(file,SUB81(file_00,0),&printer);
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n\n");
  std::__cxx11::string::~string((string *)&fullname);
  io::Printer::~Printer(&printer);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void GenerateMetadataFile(const FileDescriptor* file,
                          bool is_descriptor,
                          GeneratorContext* generator_context) {
  std::string filename = GeneratedMetadataFileName(file, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  GenerateAddFileToPool(file, is_descriptor, &printer);

  Outdent(&printer);
  printer.Print("}\n\n");
}